

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket-server.c
# Opt level: O1

int main(void)

{
  int __fd;
  int iVar1;
  int extraout_EAX;
  ssize_t sVar2;
  int length;
  sockaddr_in name;
  char buf [1024];
  socklen_t local_41c;
  sockaddr local_418;
  undefined1 local_408 [1024];
  
  __fd = socket(2,2,0);
  if (__fd < 0) {
    main_cold_3();
  }
  else {
    local_418.sa_family = 2;
    local_418.sa_data[0] = '\0';
    local_418.sa_data[1] = '\0';
    local_418.sa_data[2] = '\0';
    local_418.sa_data[3] = '\0';
    local_418.sa_data[4] = '\0';
    local_418.sa_data[5] = '\0';
    iVar1 = bind(__fd,&local_418,0x10);
    if (iVar1 == 0) {
      local_41c = 0x10;
      iVar1 = getsockname(__fd,&local_418,&local_41c);
      if (iVar1 == 0) {
        printf("Socket has port #%d\n",
               (ulong)(ushort)(local_418.sa_data._0_2_ << 8 | (ushort)local_418.sa_data._0_2_ >> 8))
        ;
        sVar2 = read(__fd,local_408,0x400);
        if (sVar2 < 0) {
          perror("receiving datagram packet");
        }
        printf("-->%s\n",local_408);
        close(__fd);
        return 0;
      }
      goto LAB_001012b7;
    }
  }
  main_cold_1();
LAB_001012b7:
  main_cold_2();
  return extraout_EAX;
}

Assistant:

int main()
{
    int sock, length;
    struct sockaddr_in name;
    char buf[1024];

    /* Create socket from which to read. */
    sock = socket(AF_INET, SOCK_DGRAM, 0);
    if (sock < 0) {
        perror("opening datagram socket");
        exit(1);
    }
    /* Create name with wildcards. */
    name.sin_family = AF_INET;
    name.sin_addr.s_addr = INADDR_ANY;
    name.sin_port = 0;
    if (bind(sock, (struct sockaddr *)&name, sizeof(name))) {
        perror("binding datagram socket");
        exit(1);
    }
    /* Find assigned port value and print it out. */
    length = sizeof(name);
    if (getsockname(sock, (struct sockaddr *)&name, &length)) {
        perror("getting socket name");
        exit(1);
    }
    printf("Socket has port #%d\n", ntohs(name.sin_port));
    /* Read from the socket */
    if (read(sock, buf, sizeof(buf)) < 0)
        perror("receiving datagram packet");
    printf("-->%s\n", buf);
    close(sock);
    return 0;
}